

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

void arima_summary(arima_object obj)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  double dVar9;
  
  iVar5 = obj->q;
  iVar1 = obj->p;
  iVar2 = obj->M;
  if ((uint)obj->method < 2) {
    puts("\n\nExit Status ");
    printf("Return Code : %d \n",(ulong)(uint)obj->retval);
    printf("Exit Message : ");
    iVar6 = obj->retval;
    if (iVar6 == 0) {
      pcVar3 = "Input Error";
    }
    else if (iVar6 == 0xf) {
      pcVar3 = "Optimization Routine Encountered Inf/Nan Values";
    }
    else if (iVar6 == 4) {
      pcVar3 = "Optimization Routine didn\'t converge";
    }
    else {
      if (iVar6 != 1) goto LAB_0010e895;
      pcVar3 = "Probable Success";
    }
    printf(pcVar3);
  }
LAB_0010e895:
  puts("\n");
  iVar6 = 0;
  printf(" ARIMA Order : ( %d, %d, %d) \n",(ulong)(uint)obj->p,(ulong)(uint)obj->d,
         (ulong)(uint)obj->q);
  putchar(10);
  printf("%-20s%-20s%-20s \n\n","Coefficients","Value","Standard Error");
  iVar5 = iVar5 + iVar1 + iVar2 + 1;
  for (lVar8 = 0; lVar8 < obj->p; lVar8 = lVar8 + 1) {
    dVar9 = obj->phi[lVar8];
    if (obj->vcov[iVar6] < 0.0) {
      sqrt(obj->vcov[iVar6]);
    }
    printf("AR%-15d%-20g%-20g \n",dVar9,(ulong)((int)lVar8 + 1));
    iVar6 = iVar6 + iVar5;
  }
  for (lVar8 = 0; lVar8 < obj->q; lVar8 = lVar8 + 1) {
    dVar9 = obj->theta[lVar8];
    if (obj->vcov[(obj->p + (int)lVar8) * iVar5] < 0.0) {
      sqrt(obj->vcov[(obj->p + (int)lVar8) * iVar5]);
    }
    printf("MA%-15d%-20g%-20g \n",dVar9,(ulong)((int)lVar8 + 1));
  }
  putchar(10);
  if (obj->M == 1) {
    dVar9 = obj->mean;
    if (obj->vcov[(obj->q + obj->p) * iVar5] < 0.0) {
      sqrt(obj->vcov[(obj->q + obj->p) * iVar5]);
    }
    printf("%-17s%-20g%-20g \n",dVar9,"MEAN");
  }
  else {
    printf("%-17s%-20g \n",obj->mean,"MEAN");
  }
  putchar(10);
  printf("%-17s%-20g \n",obj->var,"SIGMA^2");
  putchar(10);
  printf("ESTIMATION METHOD : ");
  if ((ulong)(uint)obj->method < 3) {
    printf(*(char **)(&DAT_00158cf8 + (ulong)(uint)obj->method * 8));
  }
  puts("\n");
  printf("OPTIMIZATION METHOD : ");
  if (obj->method == 2) {
    pcVar3 = "Newton-Raphson";
  }
  else {
    if (7 < (ulong)(uint)obj->optmethod) goto LAB_0010eadf;
    pcVar3 = (&PTR_anon_var_dwarf_b78_00158da8)[(uint)obj->optmethod];
  }
  printf(pcVar3);
LAB_0010eadf:
  puts("\n");
  uVar7 = 0;
  printf("EQUATION FORM : x[t] ");
LAB_0010eb15:
  do {
    if ((long)obj->p <= (long)uVar7) break;
    dVar9 = obj->phi[uVar7];
    if (0.0 < dVar9) {
      pcVar4 = "- %g*x[t - %d%s";
      pcVar3 = "]";
    }
    else {
      if (0.0 <= dVar9) {
        uVar7 = uVar7 + 1;
        goto LAB_0010eb15;
      }
      dVar9 = ABS(dVar9);
      pcVar4 = "+ %g*x[t - %d%s";
      pcVar3 = "] ";
    }
    uVar7 = uVar7 + 1;
    printf(pcVar4,dVar9,uVar7 & 0xffffffff,pcVar3);
  } while( true );
  putchar(0x3d);
  if ((obj->mean != 0.0) || (NAN(obj->mean))) {
    printf(" %g +");
  }
  uVar7 = 0;
  printf(" a[t] ");
LAB_0010ebbd:
  do {
    if ((long)obj->q <= (long)uVar7) {
      puts("\n");
      if ((uint)obj->method < 2) {
        printf("Log Likelihood : %g ",obj->loglik);
      }
      else {
        printf("Log Likelihood : Unavailable ");
      }
      puts("\n");
      if (obj->method == 0) {
        printf("AIC criterion : %g ",obj->aic);
      }
      else {
        printf("AIC Criterion : Unavailable ");
      }
      puts("\n");
      return;
    }
    dVar9 = obj->theta[uVar7];
    if (0.0 < dVar9) {
      pcVar4 = "- %g*a[t - %d%s";
      pcVar3 = "]";
    }
    else {
      if (0.0 < obj->phi[uVar7] || obj->phi[uVar7] == 0.0) {
        uVar7 = uVar7 + 1;
        goto LAB_0010ebbd;
      }
      dVar9 = ABS(dVar9);
      pcVar4 = "+ %g*a[t - %d%s";
      pcVar3 = "] ";
    }
    uVar7 = uVar7 + 1;
    printf(pcVar4,dVar9,uVar7 & 0xffffffff,pcVar3);
  } while( true );
}

Assistant:

void arima_summary(arima_object obj) {
	int i, pq,t;
	pq = obj->p + obj->q + obj->M;
	if (obj->method == 0 || obj->method == 1) {
		printf("\n\nExit Status \n");
		printf("Return Code : %d \n", obj->retval);
		printf("Exit Message : ");

		if (obj->retval == 0) {
			printf("Input Error");
		}
		else if (obj->retval == 1) {
			printf("Probable Success");
		}
		else if (obj->retval == 4) {
			printf("Optimization Routine didn't converge");
		}
		else if (obj->retval == 15) {
			printf("Optimization Routine Encountered Inf/Nan Values");
		}
	}
	printf("\n\n");
	printf(" ARIMA Order : ( %d, %d, %d) \n", obj->p, obj->d, obj->q);
	printf("\n");
	printf("%-20s%-20s%-20s \n\n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->p; ++i) {
		printf("AR%-15d%-20g%-20g \n", i + 1, obj->phi[i],sqrt(obj->vcov[i+pq*i]));
	}
	for (i = 0; i < obj->q; ++i) {
		t = obj->p + i;
		printf("MA%-15d%-20g%-20g \n", i + 1, obj->theta[i], sqrt(obj->vcov[t + pq * t]));
	}
	printf("\n");
	t = obj->p + obj->q;
	if (obj->M == 1) {
		printf("%-17s%-20g%-20g \n", "MEAN", obj->mean, sqrt(obj->vcov[t + pq * t]));
	}
	else {
		printf("%-17s%-20g \n", "MEAN", obj->mean);
	}
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->var);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->method == 0) {
		printf("MLE");
	}
	else if (obj->method == 1) {
		printf("CSS");
	}
	else if (obj->method == 2) {
		printf("BOX-JENKINS");
	}
	printf("\n\n");
	printf("OPTIMIZATION METHOD : ");
	if (obj->method == 2) {
		printf("Newton-Raphson");
	}
	else {
		if (obj->optmethod == 0) {
			printf("Nelder-Mead");
		}
		else if (obj->optmethod == 1) {
			printf("Newton Line Search");
		}
		else if (obj->optmethod == 2) {
			printf("Newton Trust Region - Hook Step");
		}
		else if (obj->optmethod == 3) {
			printf("Newton Trust Region - Double Dog-Leg");
		}
		else if (obj->optmethod == 4) {
			printf("Conjugate Gradient");
		}
		else if (obj->optmethod == 5) {
			printf("BFGS");
		}
		else if (obj->optmethod == 6) {
			printf("L-BFGS");
		}
		else if (obj->optmethod == 7) {
			printf("BFGS More-Thuente Line Search");
		}
	}
	printf("\n\n");
	printf("EQUATION FORM : x[t] ");
	for (i = 0; i < obj->p; ++i) {
		if (obj->phi[i] > 0) {
			printf("- %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "] ");
		}
	}

	printf("=");
	if (obj->mean != 0.0) {
		printf(" %g +", obj->mean);
	}
	printf(" a[t] ");
	for (i = 0; i < obj->q; ++i) {
		if (obj->theta[i] > 0) {
			printf("- %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "] ");
		}
	}
	printf("\n\n");
	if (obj->method == 0 || obj->method == 1) {
		printf("Log Likelihood : %g ", obj->loglik);
		printf("\n\n");
	}
	else {
		printf("Log Likelihood : Unavailable ");
		printf("\n\n");
	}
	if (obj->method == 0) {
		printf("AIC criterion : %g ", obj->aic);
		printf("\n\n");
	}
	else {
		printf("AIC Criterion : Unavailable ");
		printf("\n\n");
	}
}